

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceMatrixDecomposition.cpp
# Opt level: O2

void __thiscall
OpenMD::ForceMatrixDecomposition::unpackInteractionData
          (ForceMatrixDecomposition *this,InteractionData *idat,int atom1,int atom2)

{
  pointer pdVar1;
  uint uVar2;
  
  Vector<double,_7U>::add(&(this->super_ForceDecomposition).pairwisePot,&idat->pot);
  Vector<double,_7U>::add(&(this->super_ForceDecomposition).excludedPot,&idat->excludedPot);
  Vector<double,_7U>::add(&(this->super_ForceDecomposition).selectedPot,&idat->selePot);
  Vector<double,_3U>::add
            (&(((this->super_ForceDecomposition).snap_)->atomData).force.
              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start[atom1].super_Vector<double,_3U>,
             &(idat->f1).super_Vector<double,_3U>);
  Vector<double,_3U>::sub
            (&(((this->super_ForceDecomposition).snap_)->atomData).force.
              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start[atom2].super_Vector<double,_3U>,
             &(idat->f1).super_Vector<double,_3U>);
  if (idat->doParticlePot == true) {
    pdVar1 = (((this->super_ForceDecomposition).snap_)->atomData).particlePot.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar1[atom1] = idat->vpair * idat->sw + pdVar1[atom1];
    pdVar1[atom2] = idat->vpair * idat->sw + pdVar1[atom2];
  }
  uVar2 = (this->super_ForceDecomposition).atomStorageLayout_;
  if ((uVar2 >> 0x10 & 1) != 0) {
    pdVar1 = (((this->super_ForceDecomposition).snap_)->atomData).flucQFrc.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar1[atom1] = pdVar1[atom1] - idat->dVdFQ1;
    pdVar1[atom2] = pdVar1[atom2] - idat->dVdFQ2;
  }
  if ((uVar2 >> 0xc & 1) != 0) {
    Vector<double,_3U>::add
              (&(((this->super_ForceDecomposition).snap_)->atomData).electricField.
                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start[atom1].super_Vector<double,_3U>,
               &(idat->eField1).super_Vector<double,_3U>);
    Vector<double,_3U>::add
              (&(((this->super_ForceDecomposition).snap_)->atomData).electricField.
                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start[atom2].super_Vector<double,_3U>,
               &(idat->eField2).super_Vector<double,_3U>);
    uVar2 = (this->super_ForceDecomposition).atomStorageLayout_;
  }
  if ((uVar2 >> 0x11 & 1) != 0) {
    pdVar1 = (((this->super_ForceDecomposition).snap_)->atomData).sitePotential.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar1[atom1] = idat->sPot1 + pdVar1[atom1];
    pdVar1[atom2] = idat->sPot2 + pdVar1[atom2];
  }
  if ((uVar2 & 0x20) != 0) {
    Vector<double,_3U>::operator=
              (&(((this->super_ForceDecomposition).snap_)->atomData).torque.
                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start[atom1].super_Vector<double,_3U>,
               &(idat->t1).super_Vector<double,_3U>);
    Vector<double,_3U>::operator=
              (&(((this->super_ForceDecomposition).snap_)->atomData).torque.
                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start[atom2].super_Vector<double,_3U>,
               &(idat->t2).super_Vector<double,_3U>);
    uVar2 = (this->super_ForceDecomposition).atomStorageLayout_;
  }
  if ((uVar2 >> 0xd & 1) != 0) {
    pdVar1 = (((this->super_ForceDecomposition).snap_)->atomData).skippedCharge.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar1[atom1] = idat->skippedCharge1;
    pdVar1[atom2] = idat->skippedCharge2;
  }
  return;
}

Assistant:

void ForceMatrixDecomposition::unpackInteractionData(InteractionData& idat,
                                                       int atom1, int atom2) {
#ifdef IS_MPI
    pot_row[atom1] += 0.5 * idat.pot;
    pot_col[atom2] += 0.5 * idat.pot;
    expot_row[atom1] += 0.5 * idat.excludedPot;
    expot_col[atom2] += 0.5 * idat.excludedPot;
    selepot_row[atom1] += 0.5 * idat.selePot;
    selepot_col[atom2] += 0.5 * idat.selePot;

    atomRowData.force[atom1] += idat.f1;
    atomColData.force[atom2] -= idat.f1;

    if (atomStorageLayout_ & DataStorage::dslFlucQForce) {
      atomRowData.flucQFrc[atom1] -= idat.dVdFQ1;
      atomColData.flucQFrc[atom2] -= idat.dVdFQ2;
    }

    if (atomStorageLayout_ & DataStorage::dslElectricField) {
      atomRowData.electricField[atom1] += idat.eField1;
      atomColData.electricField[atom2] += idat.eField2;
    }

    if (atomStorageLayout_ & DataStorage::dslSitePotential) {
      atomRowData.sitePotential[atom1] += idat.sPot1;
      atomColData.sitePotential[atom2] += idat.sPot2;
    }

    if (atomStorageLayout_ & DataStorage::dslTorque) {
      atomRowData.torque[atom1] = idat.t1;
      atomColData.torque[atom2] = idat.t2;
    }

    if (atomStorageLayout_ & DataStorage::dslSkippedCharge) {
      atomRowData.skippedCharge[atom1] = idat.skippedCharge1;
      atomColData.skippedCharge[atom2] = idat.skippedCharge2;
    }

#else
    pairwisePot += idat.pot;
    excludedPot += idat.excludedPot;
    selectedPot += idat.selePot;

    snap_->atomData.force[atom1] += idat.f1;
    snap_->atomData.force[atom2] -= idat.f1;

    if (idat.doParticlePot) {
      // This is the pairwise contribution to the particle pot.  The
      // self and embedding contribution is added in each of the low
      // level non-bonded routines.  In parallel, this calculation is
      // done in collectData, not in unpackInteractionData.
      snap_->atomData.particlePot[atom1] += idat.vpair * idat.sw;
      snap_->atomData.particlePot[atom2] += idat.vpair * idat.sw;
    }

    if (atomStorageLayout_ & DataStorage::dslFlucQForce) {
      snap_->atomData.flucQFrc[atom1] -= idat.dVdFQ1;
      snap_->atomData.flucQFrc[atom2] -= idat.dVdFQ2;
    }

    if (atomStorageLayout_ & DataStorage::dslElectricField) {
      snap_->atomData.electricField[atom1] += idat.eField1;
      snap_->atomData.electricField[atom2] += idat.eField2;
    }

    if (atomStorageLayout_ & DataStorage::dslSitePotential) {
      snap_->atomData.sitePotential[atom1] += idat.sPot1;
      snap_->atomData.sitePotential[atom2] += idat.sPot2;
    }

    if (atomStorageLayout_ & DataStorage::dslTorque) {
      snap_->atomData.torque[atom1] = idat.t1;
      snap_->atomData.torque[atom2] = idat.t2;
    }

    if (atomStorageLayout_ & DataStorage::dslSkippedCharge) {
      snap_->atomData.skippedCharge[atom1] = idat.skippedCharge1;
      snap_->atomData.skippedCharge[atom2] = idat.skippedCharge2;
    }

#endif
  }